

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

bool ggml_graph_compute_helper
               (ggml_cgraph *graph,int n_threads,ggml_abort_callback abort_callback,
               void *abort_callback_data)

{
  bool extraout_AL;
  undefined8 uVar1;
  code *pcVar2;
  ggml_backend_ptr backend;
  _Head_base<0UL,_ggml_backend_*,_false> local_20;
  
  local_20._M_head_impl = (ggml_backend *)ggml_backend_init_by_type(0,0);
  uVar1 = ggml_backend_get_device(local_20._M_head_impl);
  uVar1 = ggml_backend_dev_backend_reg(uVar1);
  pcVar2 = (code *)ggml_backend_reg_get_proc_address(uVar1,"ggml_backend_set_abort_callback");
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(local_20._M_head_impl,0,0);
  }
  pcVar2 = (code *)ggml_backend_reg_get_proc_address(uVar1,"ggml_backend_set_n_threads");
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(local_20._M_head_impl,n_threads);
  }
  ggml_backend_graph_compute(local_20._M_head_impl,graph);
  std::unique_ptr<ggml_backend,_ggml_backend_deleter>::~unique_ptr
            ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)&local_20);
  return extraout_AL;
}

Assistant:

static bool ggml_graph_compute_helper(
          struct ggml_cgraph * graph,
                         int   n_threads,
         ggml_abort_callback   abort_callback,
                        void * abort_callback_data) {

    ggml_backend_ptr backend { ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr) };

    auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend.get()));

    auto * set_abort_callback_fn = (ggml_backend_set_abort_callback_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_abort_callback");
    if (set_abort_callback_fn) {
        set_abort_callback_fn(backend.get(), abort_callback, abort_callback_data);
    }

    auto ggml_backend_set_n_threads_fn = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
    if (ggml_backend_set_n_threads_fn) {
        ggml_backend_set_n_threads_fn(backend.get(), n_threads);
    }

    return ggml_backend_graph_compute(backend.get(), graph) == GGML_STATUS_SUCCESS;
}